

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall Instance::print(Instance *this)

{
  uint uVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  
  puts("Instance:");
  if (0 < this->m) {
    piVar2 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      printf("i=%d (nopts: %d, demand: %d)\n",uVar6 & 0xffffffff,(ulong)(uint)piVar2[uVar5],
             (ulong)(uint)(this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      piVar2 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < piVar2[uVar5]) {
        lVar3 = (long)(int)lVar3;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          printf("  opt=%d: (");
          if (0 < this->ndims) {
            i = 0;
            do {
              if (i != 0) {
                printf(", ");
              }
              uVar1 = Item::operator[]((this->items).super__Vector_base<Item,_std::allocator<Item>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar3,i);
              printf("%d",(ulong)uVar1);
              i = i + 1;
            } while (i < this->ndims);
          }
          puts(")");
          lVar3 = lVar3 + 1;
          piVar2 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (iVar4 < piVar2[uVar5]);
      }
      uVar5 = uVar6;
    } while ((long)uVar6 < (long)this->m);
  }
  return;
}

Assistant:

void Instance::print() const {
	printf("Instance:\n");
	int p = 0;
	for (int i = 0; i < m; i++) {
		printf("i=%d (nopts: %d, demand: %d)\n", i + 1, nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			printf("  opt=%d: (", q + 1);
			for (int j = 0; j < ndims; j++) {
				if (j) {
					printf(", ");
				}
				printf("%d", items[p][j]);
			}
			printf(")\n");
			p++;
		}
	}
}